

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tc_test.cpp
# Opt level: O2

int __thiscall test_app::upperB::convert(upperB *this,char *begin,char *end,streambuf *out)

{
  int iVar1;
  
  do {
    if (begin == end) {
      return 0;
    }
    begin = begin + 1;
    iVar1 = std::streambuf::sputc((char)out);
  } while (iVar1 != -1);
  return -1;
}

Assistant:

int convert(char const *begin,char const *end,std::streambuf *out)
		{
			while(begin!=end) {
				char c=*begin++;
				if('a'<=c && c<='z')
					c = 'A' + (c-'a');
				if(out->sputc(c)==EOF)
					return -1;
			}
			return 0;
		}